

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int pushmode(lua_State *L,int oldmode)

{
  int extraout_EAX;
  char *pcVar1;
  
  if (oldmode != -1) {
    pcVar1 = "generational";
    if (oldmode == 8) {
      pcVar1 = "incremental";
    }
    pcVar1 = lua_pushstring(L,pcVar1);
    return (int)pcVar1;
  }
  lua_pushnil(L);
  return extraout_EAX;
}

Assistant:

static int pushmode (lua_State *L, int oldmode) {
  if (oldmode == -1)
    luaL_pushfail(L);  /* invalid call to 'lua_gc' */
  else
    lua_pushstring(L, (oldmode == LUA_GCINC) ? "incremental"
                                             : "generational");
  return 1;
}